

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O2

Polynom<Finite> __thiscall Polynom<Finite>::operator*(Polynom<Finite> *this,Finite *f)

{
  Matrix<Finite> *a;
  BigInteger *in_RDX;
  Finite *extraout_RDX;
  Polynom<Finite> PVar1;
  Polynom<Finite> temp;
  Matrix<Finite> local_40;
  BigInteger local_30;
  
  Matrix<Finite>::Matrix(&local_40,(Matrix<Finite> *)f);
  BigInteger::BigInteger(&local_30,in_RDX);
  a = &operator*=((Polynom<Finite> *)&local_40,(Finite *)&local_30)->m;
  Matrix<Finite>::Matrix(&this->m,a);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  Matrix<Finite>::~Matrix(&local_40);
  PVar1.m.arr = extraout_RDX;
  PVar1.m._0_8_ = this;
  return (Polynom<Finite>)PVar1.m;
}

Assistant:

inline const Polynom operator*(Field f) const
    {
        Polynom temp(*this);
        return temp *= f;
    }